

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O3

SearchEntry * __thiscall
HPack::FieldLookupTable::frontKey(SearchEntry *__return_storage_ptr__,FieldLookupTable *this)

{
  quint32 qVar1;
  _Elt_pointer puVar2;
  _Head_base<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_false>
  _Var3;
  HeaderField *pHVar4;
  
  pHVar4 = front(this);
  puVar2 = (this->chunks).
           super__Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->chunks).
      super__Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != puVar2) {
    _Var3._M_head_impl =
         (puVar2->_M_t).
         super___uniq_ptr_impl<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
         .
         super__Head_base<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_false>
         ._M_head_impl;
    qVar1 = this->begin;
    __return_storage_ptr__->field = pHVar4;
    __return_storage_ptr__->chunk = _Var3._M_head_impl;
    __return_storage_ptr__->offset = qVar1;
    __return_storage_ptr__->table = this;
    return __return_storage_ptr__;
  }
  frontKey();
}

Assistant:

FieldLookupTable::SearchEntry FieldLookupTable::frontKey() const
{
    Q_ASSERT(chunks.size() && end != begin);
    return SearchEntry(&front(), chunks.front().get(), begin, this);
}